

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int flushsocket(SOCKET sock)

{
  ssize_t sVar1;
  fd_set *__arr;
  undefined1 local_4a8 [4];
  uint __i;
  char recvbuf [1024];
  undefined1 auStack_a0 [4];
  int iResult;
  timeval timeout;
  fd_set sock_set;
  SOCKET sock_local;
  
  memset(auStack_a0,0,0x10);
  recvbuf[0x3fc] = -1;
  recvbuf[0x3fd] = -1;
  recvbuf[0x3fe] = -1;
  recvbuf[0x3ff] = -1;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    sock_set.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  sock_set.fds_bits[(long)(sock / 0x40) + -1] =
       1L << ((byte)((long)sock % 0x40) & 0x3f) | sock_set.fds_bits[(long)(sock / 0x40) + -1];
  recvbuf._1020_4_ =
       select(sock + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)auStack_a0)
  ;
  while( true ) {
    if ((int)recvbuf._1020_4_ < 1) {
      sock_set.fds_bits[(long)(sock / 0x40) + -1] =
           (1L << ((byte)((long)sock % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
           sock_set.fds_bits[(long)(sock / 0x40) + -1];
      sock_set.fds_bits[0xf]._5_3_ = 0;
      sock_set.fds_bits[0xf]._4_1_ = recvbuf._1020_4_ == -1;
      return sock_set.fds_bits[0xf]._4_4_;
    }
    sVar1 = recv(sock,local_4a8,0x400,0);
    if (sVar1 < 1) break;
    _auStack_a0 = 0;
    timeout.tv_sec = 0;
    recvbuf._1020_4_ =
         select(sock + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                (timeval *)auStack_a0);
  }
  sock_set.fds_bits[(long)(sock / 0x40) + -1] =
       (1L << ((byte)((long)sock % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       sock_set.fds_bits[(long)(sock / 0x40) + -1];
  return 1;
}

Assistant:

inline int flushsocket(SOCKET sock)
{
	fd_set sock_set;
	struct timeval timeout = {0, 0}; // Timeout of 0 s for select().
	int iResult = SOCKET_ERROR;
	char recvbuf[1024];

	// Initialize a fd_set and add the socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(sock, &sock_set);

	// Check the readability of the socket in the fd_set.
	iResult = select((int)sock+1, &sock_set, NULL, NULL, &timeout);

	while (iResult > 0)
	{
		// There is some data on the socket.
		if (recv(sock, recvbuf, 1024*sizeof(char), 0) <= 0)
		{
			PRINT_DEBUG_ERROR_OSNET(("flushsocket error (%s) : %s(sock=%d)\n", 
				strtime_m(), 
				"recv failed or timed out. ", 
				(int)sock));
			FD_CLR(sock, &sock_set); 
			return EXIT_FAILURE;
		}
		// Reset timeout (because a previous call to select may have modified it).
		timeout.tv_sec = 0;
		timeout.tv_usec = 0;
		// Check the readability of the socket in the fd_set.
		iResult = select((int)sock+1, &sock_set, NULL, NULL, &timeout);
	}

	// Remove the socket from the set.
	FD_CLR(sock, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("flushsocket error (%s) : %s(sock=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)sock));
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}